

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream-test.cc
# Opt level: O0

void __thiscall OStreamTest_Print_Test::TestBody(OStreamTest_Print_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  wostringstream wos;
  AssertionResult gtest_ar;
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  char *in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  int line;
  ostringstream *this_01;
  Type in_stack_fffffffffffffc7c;
  AssertHelper *in_stack_fffffffffffffc80;
  wchar_t (*in_stack_fffffffffffffc88) [10];
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_fffffffffffffc90;
  AssertionResult local_358;
  wostringstream local_348 [16];
  Message *in_stack_fffffffffffffcc8;
  AssertHelper *in_stack_fffffffffffffcd0;
  string local_1c0 [32];
  AssertionResult local_1a0 [2];
  ostringstream local_180 [384];
  
  this_01 = local_180;
  std::__cxx11::ostringstream::ostringstream(this_01);
  fmt::v5::print<char[10],char[6]>
            ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc90,
             (char (*) [10])in_stack_fffffffffffffc88,(char (*) [6])in_stack_fffffffffffffc80);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<char[13],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
             in_stack_fffffffffffffc60,
             (char (*) [13])CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             in_stack_fffffffffffffc50);
  std::__cxx11::string::~string(local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1a0);
  line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffc6c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x112291);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)this_01,line,
               in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffc50);
    testing::Message::~Message((Message *)0x1122ee);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x112346);
  std::__cxx11::wostringstream::wostringstream(local_348);
  fmt::v5::print<wchar_t[10],wchar_t[6]>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,
             (wchar_t (*) [6])in_stack_fffffffffffffc80);
  std::__cxx11::wostringstream::str();
  testing::internal::EqHelper<false>::Compare<wchar_t[13],std::__cxx11::wstring>
            ((char *)CONCAT44(line,in_stack_fffffffffffffc68),in_stack_fffffffffffffc60,
             (wchar_t (*) [13])CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffc50);
  std::__cxx11::wstring::~wstring((wstring *)&stack0xfffffffffffffc88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffc80);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x112449)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffc80,in_stack_fffffffffffffc7c,(char *)this_01,line,
               in_stack_fffffffffffffc60);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x112497);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1124e3);
  std::__cxx11::wostringstream::~wostringstream(local_348);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

TEST(OStreamTest, Print) {
  std::ostringstream os;
  fmt::print(os, "Don't {}!", "panic");
  EXPECT_EQ("Don't panic!", os.str());
  std::wostringstream wos;
  fmt::print(wos, L"Don't {}!", L"panic");
  EXPECT_EQ(L"Don't panic!", wos.str());
}